

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_things.cpp
# Opt level: O1

PClassActor * P_GetSpawnableType(int spawnnum)

{
  Node *pNVar1;
  PClass *p;
  PClassActor *pPVar2;
  Node *pNVar3;
  FName local_14;
  
  if (spawnnum < 0) {
    if ((uint)-spawnnum < (uint)FName::NameData.NumNames) {
      p = PClass::FindClass(&local_14);
      pPVar2 = dyn_cast<PClassActor>((DObject *)p);
      return pPVar2;
    }
  }
  else {
    pNVar1 = SpawnableThings.Nodes + (SpawnableThings.Size + 0x7fffffff & spawnnum);
    do {
      pNVar3 = pNVar1;
      if ((pNVar3 == (Node *)0x0) || (pNVar3->Next == (Node *)0x1)) {
        pNVar3 = (Node *)0x0;
        break;
      }
      pNVar1 = pNVar3->Next;
    } while ((pNVar3->Pair).Key != spawnnum);
    if (pNVar3 != (Node *)0x0) {
      return (pNVar3->Pair).Value;
    }
  }
  return (PClassActor *)0x0;
}

Assistant:

PClassActor *P_GetSpawnableType(int spawnnum)
{
	if (spawnnum < 0)
	{ // A named arg from a UDMF map
		FName spawnname = FName(ENamedName(-spawnnum));
		if (spawnname.IsValidName())
		{
			return PClass::FindActor(spawnname);
		}
	}
	else
	{ // A numbered arg from a Hexen or UDMF map
		PClassActor **type = SpawnableThings.CheckKey(spawnnum);
		if (type != NULL)
		{
			return *type;
		}
	}
	return NULL;
}